

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

Expression * __thiscall
wasm::OptimizeInstructions::optimizeWithConstantOnRight(OptimizeInstructions *this,Binary *curr)

{
  Type *pTVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Type type;
  Op OVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  UnaryOp UVar7;
  BinaryOp BVar8;
  Index IVar9;
  BinaryOp BVar10;
  ulong uVar11;
  Const *left_00;
  Binary *pBVar12;
  _Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_> _Var13;
  Expression *pEVar14;
  undefined4 extraout_var;
  anon_union_16_6_1532cd5a_for_Literal_0 *this_00;
  OptimizeInstructions *localInfoProvider;
  Literal *this_01;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [24];
  Binary *inner;
  undefined1 local_1f8 [8];
  Binary *bin;
  anon_union_16_6_1532cd5a_for_Literal_0 local_1e8;
  Type local_1d8;
  pointer pLStack_1d0;
  undefined1 local_1b0 [8];
  Binary *inner_1;
  undefined1 local_1a0 [8];
  Const *c;
  anon_union_16_6_1532cd5a_for_Literal_0 local_190;
  undefined1 local_178 [8];
  Const *c_1;
  anon_union_16_6_1532cd5a_for_Literal_0 local_168;
  Type local_158;
  pointer pLStack_150;
  anon_union_16_6_1532cd5a_for_Literal_0 local_130;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  *local_120;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_118;
  pointer local_110;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_108;
  _Alloc_hider local_e8;
  Builder builder;
  _Head_base<0UL,_wasm::DylinkSection_*,_false> local_90;
  Expression *left;
  anon_union_16_6_1532cd5a_for_Literal_0 local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Alloc_hider local_60;
  _Alloc_hider _Stack_58;
  _Alloc_hider local_38;
  
  local_e8._M_p =
       (pointer)(this->
                super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                ).
                super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                .
                super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                .currModule;
  left = (Expression *)this;
  local_38._M_p = (pointer)Expression::cast<wasm::Const>(curr->right);
  type.id = (curr->right->type).id;
  local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
               *)local_1b0;
  local_70._M_allocated_capacity = 0;
  local_80.i64 = 0;
  local_130.i64 = 0;
  local_60._M_p = (pointer)0x0;
  _Stack_58._M_p = (pointer)0x0;
  local_130._8_4_ = 10;
  local_1b0 = (undefined1  [8])&local_90;
  local_118 = &local_80;
  bVar6 = Match::Internal::
          Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
          ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                     *)&local_130.func,
                    (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                     )curr);
  if (bVar6) {
    return (Expression *)
           (_Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>)
           local_90._M_head_impl;
  }
  local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
               *)0x0;
  local_130.i64 = 0;
  local_1a0 = (undefined1  [8])0x0;
  local_110 = (pointer)0x0;
  paStack_108 = (anon_union_16_6_1532cd5a_for_Literal_0 *)0x0;
  c._0_4_ = 0xb;
  local_218._16_8_ = (Global *)&local_90;
  local_190.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)((long)local_218 + 0x10);
  local_190.func.super_IString.str._M_str = (char *)&local_130;
  bVar6 = Match::Internal::
          Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
          ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                     *)local_1a0,
                    (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                     )curr);
  if (bVar6) {
    return (Expression *)(Module *)local_90._M_head_impl;
  }
  local_190.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_238;
  local_190.func.super_IString.str._M_str = (char *)&builder;
  builder.wasm = (Module *)0x0;
  local_1a0 = (undefined1  [8])0x0;
  c._0_4_ = 0xc;
  local_238._0_8_ = (Global *)&local_90;
  bVar6 = Match::Internal::
          Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
          ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                     *)local_1a0,
                    (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                     )curr);
  if (bVar6) {
    return (Expression *)local_90._M_head_impl;
  }
  local_190.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_228;
  local_168.i64 = 0;
  local_178 = (undefined1  [8])0x0;
  local_1a0 = (undefined1  [8])0x0;
  local_158.id = 0;
  pLStack_150 = (pointer)0x0;
  c._0_4_ = 0x10;
  local_228._0_8_ = (Global *)&local_90;
  local_190.func.super_IString.str._M_str =
       (char *)(Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                *)local_178;
  bVar6 = Match::Internal::
          Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
          ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                     *)local_1a0,
                    (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                     )curr);
  if (bVar6) {
    return (Expression *)(Module *)local_90._M_head_impl;
  }
  local_190.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_218;
  local_190.func.super_IString.str._M_str = local_1f8;
  local_1e8.i64 = 0;
  local_1f8 = (undefined1  [8])0x0;
  local_1a0 = (undefined1  [8])0x0;
  local_1d8.id = 0;
  pLStack_1d0 = (pointer)0x0;
  c._0_4_ = 0x11;
  local_218._0_8_ = (Global *)&local_90;
  bVar6 = Match::Internal::
          Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
          ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                     *)local_1a0,
                    (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                     )curr);
  bin = (Binary *)left;
  if (bVar6) {
    return (Expression *)
           (__uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>)
           local_90._M_head_impl;
  }
  local_70._M_allocated_capacity = 0;
  c_1 = (Const *)left;
  local_80.i64 = 0;
  local_130.i64 = 0;
  local_60._M_p = (pointer)0x0;
  _Stack_58._M_p = (pointer)0x0;
  local_130._8_4_ = 5;
  local_178 = (undefined1  [8])&local_90;
  local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
               *)local_178;
  local_118 = &local_80;
  bVar6 = Match::Internal::
          Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
          ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                     *)&local_130.func,
                    (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                     )curr);
  if (bVar6) {
    return (Expression *)(Const *)local_38._M_p;
  }
  local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
               *)0x0;
  local_130.i64 = 0;
  builder.wasm = (Module *)0x0;
  local_110 = (pointer)0x0;
  paStack_108 = (anon_union_16_6_1532cd5a_for_Literal_0 *)0x0;
  local_1f8 = (undefined1  [8])&local_90;
  bVar6 = Match::Internal::
          Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
          ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                     *)&builder,
                    (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                     )curr);
  if (bVar6) {
    return (Expression *)(Const *)local_38._M_p;
  }
  local_70._M_allocated_capacity = 0;
  local_80.i64 = 0;
  local_60._M_p = (pointer)0x0;
  _Stack_58._M_p = (pointer)0x0;
  local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
               *)0x0;
  c_1 = (Const *)CONCAT44(c_1._4_4_,4);
  local_110 = (pointer)0x0;
  local_130.i64 = 0;
  builder.wasm = (Module *)0x0;
  local_1f8 = (undefined1  [8])&local_90;
  local_178 = (undefined1  [8])((long)local_218 + 0x10);
  local_168.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_80;
  local_168.func.super_IString.str._M_str =
       (char *)(anon_union_16_6_1532cd5a_for_Literal_0 *)local_1f8;
  bVar6 = Match::Internal::
          Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
          ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                     *)&builder,
                    (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                     )curr);
  _Var5._M_p = local_38._M_p;
  if (bVar6) {
    if ((*(int *)((left->type).id + 0x38) == 0) &&
       (uVar11 = Literal::getInteger((Literal *)(local_38._M_p + 0x10)),
       uVar11 - 1 < (uVar11 ^ uVar11 - 1))) {
      curr->left = (Expression *)local_90._M_head_impl;
      left_00 = Expression::cast<wasm::Const>
                          ((Expression *)
                           (((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                              *)(local_218._16_8_ + 0x18))->
                           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start);
      pBVar12 = Builder::makeBinary((Builder *)&local_e8,
                                    *(BinaryOp *)
                                     &(((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                         *)local_218._16_8_)->
                                      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (Expression *)left_00,(Expression *)curr);
      return (Expression *)pBVar12;
    }
    Literal::neg((Literal *)&local_80.func,(Literal *)(_Var5._M_p + 0x10));
    Literal::operator=((Literal *)(_Var5._M_p + 0x10),(Literal *)&local_80.func);
LAB_00ae15e4:
    Literal::~Literal((Literal *)&local_80.func);
    curr->left = (Expression *)local_90._M_head_impl;
  }
  else {
    local_70._M_allocated_capacity = 0;
    local_80.i64 = 0;
    local_130.i64 = 0;
    local_60._M_p = (pointer)0x0;
    _Stack_58._M_p = (pointer)0x0;
    local_130._8_4_ = 0x14;
    local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                 *)&builder;
    local_118 = &local_80;
    builder.wasm = (Module *)&local_90;
    bVar6 = Match::Internal::
            Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
            ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                       *)&local_130.func,
                      (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                       )curr);
    localInfoProvider = (OptimizeInstructions *)left;
    if (bVar6) {
LAB_00ae159a:
      OVar4 = EqZ;
LAB_00ae159c:
      UVar7 = Abstract::getUnary(type,OVar4);
    }
    else {
      local_70._M_allocated_capacity = 0;
      local_60._M_p = (pointer)0x0;
      _Stack_58._M_p = (pointer)0x1;
      local_80.i64 = 0;
      local_130.i64 = 0;
      local_130._8_4_ = 9;
      local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                   *)&builder;
      local_118 = &local_80;
      builder.wasm = (Module *)&local_90;
      bVar6 = Match::Internal::
              Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
              ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         *)&local_130.func,
                        (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                         )curr);
      if (bVar6) {
        Literal::makeZero((Literal *)&local_80.func,type);
        _Var5._M_p = local_38._M_p;
        Literal::operator=((Literal *)(local_38._M_p + 0x10),(Literal *)&local_80.func);
        Literal::~Literal((Literal *)&local_80.func);
        return (Expression *)(Const *)_Var5._M_p;
      }
      local_1f8 = (undefined1  [8])0x0;
      local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                   *)0x0;
      local_110 = (pointer)0x0;
      local_130.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_1a0;
      local_178 = (undefined1  [8])local_1b0;
      c_1 = (Const *)CONCAT44(c_1._4_4_,9);
      local_168.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_1f8;
      local_70._M_allocated_capacity = 0;
      local_80.i64 = 0;
      builder.wasm = (Module *)0x0;
      local_60._M_p = (pointer)0x0;
      _Stack_58._M_p = (pointer)0x0;
      local_168.func.super_IString.str._M_str = (char *)&local_130;
      bVar6 = Match::Internal::
              Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
              ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         *)&((anon_union_16_6_1532cd5a_for_Literal_0 *)&builder)->func,
                        (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                         )curr);
      if (bVar6) {
        bVar6 = Literal::isSignedMin((Literal *)((long)local_1a0 + 0x10));
        if (bVar6) {
LAB_00ae178d:
          BVar8 = Abstract::getBinary((Type)((Type *)((long)local_1a0 + 8))->id,And);
          (((Literals *)((long)local_1b0 + 8))->super_SmallVector<wasm::Literal,_1UL>).fixed.
          _M_elems[0].field_0.i32 = BVar8;
          bVar6 = Literal::isSignedMin((Literal *)((long)local_1a0 + 0x10));
          if (bVar6) {
            Literal::makeSignedMax
                      ((Literal *)&local_80.func,(Type)((Type *)((long)local_1a0 + 8))->id);
            Literal::operator=((Literal *)((long)local_1a0 + 0x10),(Literal *)&local_80.func);
            this_00 = &local_80;
          }
          else {
            Literal::abs((Literal *)&local_130.func,local_1a0._0_4_ + 0x10);
            Literal::makeOne((Literal *)&builder,(Type)((Type *)((long)local_1a0 + 8))->id);
            Literal::sub((Literal *)&local_80.func,(Literal *)&local_130.func,(Literal *)&builder);
            Literal::operator=((Literal *)((long)local_1a0 + 0x10),(Literal *)&local_80.func);
            Literal::~Literal((Literal *)&local_80.func);
            Literal::~Literal((Literal *)&builder);
            this_00 = &local_130;
          }
          Literal::~Literal((Literal *)&this_00->func);
          return (Expression *)curr;
        }
        Literal::abs((Literal *)&builder,local_1a0._0_4_ + 0x10);
        uVar11 = Literal::getInteger((Literal *)&builder);
        if (uVar11 == 0) {
          Literal::~Literal((Literal *)&builder);
        }
        else {
          Literal::~Literal((Literal *)&builder);
          localInfoProvider = (OptimizeInstructions *)left;
          if ((uVar11 & uVar11 - 1) == 0) goto LAB_00ae178d;
        }
      }
      local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                   *)0x0;
      local_110 = (pointer)0x0;
      paStack_108 = (anon_union_16_6_1532cd5a_for_Literal_0 *)CONCAT44(paStack_108._4_4_,1);
      local_130.i64 = 0;
      local_80.i64 = 0;
      local_80._8_4_ = 0xf;
      local_70._M_allocated_capacity = (size_type)local_1f8;
      local_1f8 = (undefined1  [8])&local_90;
      local_70._8_8_ = &local_130;
      bVar6 = Match::Internal::
              Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&>
              ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&>
                         *)&local_80.func,
                        (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>
                         )curr);
      if (bVar6) {
LAB_00ae197b:
        IVar9 = Bits::getMaxBits<wasm::OptimizeInstructions>
                          ((Expression *)local_90._M_head_impl,localInfoProvider);
        if (IVar9 == 1) {
          return (Expression *)local_90._M_head_impl;
        }
      }
      else {
        builder.wasm = (Module *)0x0;
        local_178 = (undefined1  [8])0x0;
        c_1 = (Const *)CONCAT44(c_1._4_4_,0x10);
        local_168.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_1a0;
        local_1a0 = (undefined1  [8])&local_90;
        local_168.func.super_IString.str._M_str =
             (char *)(anon_union_16_6_1532cd5a_for_Literal_0 *)&builder;
        bVar6 = Match::Internal::
                Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&>
                ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&>
                           *)local_178,
                          (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>
                           )curr);
        if (bVar6) goto LAB_00ae197b;
        local_70._M_allocated_capacity = 0;
        local_60._M_p = (pointer)0x0;
        _Stack_58._M_p = (pointer)0x1;
        local_80.i64 = 0;
        local_178 = (undefined1  [8])0x0;
        c_1 = (Const *)CONCAT44(c_1._4_4_,0xf);
        local_168.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_1b0;
        local_1b0 = (undefined1  [8])&local_90;
        local_168.func.super_IString.str._M_str = (char *)&local_80;
        bVar6 = Match::Internal::
                Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                           *)local_178,
                          (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                           )curr);
        if (bVar6) goto LAB_00ae197b;
      }
      local_70._M_allocated_capacity = 0;
      local_60._M_p = (pointer)0x0;
      _Stack_58._M_p = (pointer)0x1;
      local_80.i64 = 0;
      local_130.i64 = 0;
      local_130._8_4_ = 0x28;
      local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                   *)local_178;
      local_178 = (undefined1  [8])&local_90;
      local_118 = &local_80;
      bVar6 = Match::Internal::
              Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
              ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         *)&local_130.func,
                        (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>
                         )curr);
      if (!bVar6) {
        local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                     *)0x0;
        local_130.i64 = 0;
        builder.wasm = (Module *)0x0;
        local_110 = (pointer)0x0;
        paStack_108 = (anon_union_16_6_1532cd5a_for_Literal_0 *)0x0;
        local_1f8 = (undefined1  [8])&local_90;
        bVar6 = Match::Internal::
                Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                           *)&builder,
                          (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>
                           )curr);
        if (bVar6) goto LAB_00ae1a44;
LAB_00ae1a6e:
        local_70._M_allocated_capacity = 0;
        local_60._M_p = (pointer)0x0;
        _Stack_58._M_p = (pointer)0x1;
        local_80.i64 = 0;
        local_130.i64 = 0;
        local_130._8_4_ = 0x15;
        local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                     *)&builder;
        local_118 = &local_80;
        builder.wasm = (Module *)&local_90;
        bVar6 = Match::Internal::
                Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                           *)&local_130.func,
                          (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                           )curr);
        if ((bVar6) &&
           (IVar9 = Bits::getMaxBits<wasm::OptimizeInstructions>
                              ((Expression *)local_90._M_head_impl,localInfoProvider), IVar9 == 1))
        goto LAB_00ae159a;
        local_70._M_allocated_capacity = 0;
        local_60._M_p = (pointer)0x0;
        _Stack_58._M_p = (pointer)0x1;
        local_80.i64 = 0;
        local_130.i64 = 0;
        local_130._8_4_ = 0x11;
        local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                     *)&builder;
        local_118 = &local_80;
        builder.wasm = (Module *)&local_90;
        bVar6 = Match::Internal::
                Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                           *)&local_130.func,
                          (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                           )curr);
        if ((bVar6) &&
           (IVar9 = Bits::getMaxBits<wasm::OptimizeInstructions>
                              ((Expression *)local_90._M_head_impl,localInfoProvider), IVar9 == 1))
        {
          UVar7 = Abstract::getUnary(type,EqZ);
          _Var13.super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl =
               (_Head_base<0UL,_wasm::DylinkSection_*,_false>)
               Builder::makeUnary((Builder *)&local_e8,UVar7,(Expression *)local_90._M_head_impl);
          pTVar1 = (Type *)&(local_90._M_head_impl)->memoryAlignment;
          local_90._M_head_impl =
               (DylinkSection *)
               _Var13.super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl;
          if (pTVar1->id != 3) {
            return (Expression *)
                   (DylinkSection *)
                   _Var13.super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl;
          }
LAB_00ae1b6c:
          UVar7 = ExtendUInt32;
          goto LAB_00ae15b9;
        }
        local_70._M_allocated_capacity = 0;
        local_60._M_p = (pointer)0x0;
        _Stack_58._M_p = (pointer)0x1;
        local_80.i64 = 0;
        local_130.i64 = 0;
        local_130._8_4_ = 0x10;
        local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                     *)&builder;
        local_118 = &local_80;
        builder.wasm = (Module *)&local_90;
        bVar6 = Match::Internal::
                Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                           *)&local_130.func,
                          (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                           )curr);
        if ((bVar6) &&
           (IVar9 = Bits::getMaxBits<wasm::OptimizeInstructions>
                              ((Expression *)local_90._M_head_impl,localInfoProvider), IVar9 == 1))
        goto LAB_00ae1c80;
        local_70._M_allocated_capacity = 0;
        local_60._M_p = (pointer)0x0;
        _Stack_58._M_p = (pointer)0xffffffffffffffff;
        local_80.i64 = 0;
        local_130.i64 = 0;
        local_130._8_4_ = 0xf;
        local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                     *)&builder;
        local_118 = &local_80;
        builder.wasm = (Module *)&local_90;
        bVar6 = Match::Internal::
                Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                           *)&local_130.func,
                          (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                           )curr);
        if (bVar6) {
          return (Expression *)
                 (__uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>)
                 local_90._M_head_impl;
        }
        local_70._M_allocated_capacity = 0;
        local_60._M_p = (pointer)0x0;
        _Stack_58._M_p = (pointer)0xffffffffffffffff;
        local_80.i64 = 0;
        local_130.i64 = 0;
        local_130._8_4_ = 0x10;
        local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                     *)&builder;
        local_118 = &local_80;
        builder.wasm = (Module *)&local_90;
        bVar6 = Match::Internal::
                Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                           *)&local_130.func,
                          (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                           )curr);
        localInfoProvider = (OptimizeInstructions *)left;
        if (bVar6) goto LAB_00ae1c80;
        local_70._M_allocated_capacity = 0;
        local_60._M_p = (pointer)0x0;
        _Stack_58._M_p = (pointer)0xffffffffffffffff;
        local_80.i64 = 0;
        local_130.i64 = 0;
        local_130._8_4_ = 9;
        local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                     *)&builder;
        local_118 = &local_80;
        builder.wasm = (Module *)&local_90;
        bVar6 = Match::Internal::
                Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                           *)&local_130.func,
                          (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                           )curr);
        if (bVar6) {
          Literal::makeZero((Literal *)&local_80.func,type);
          Literal::operator=((Literal *)(local_38._M_p + 0x10),(Literal *)&local_80.func);
          Literal::~Literal((Literal *)&local_80.func);
          return (Expression *)(Const *)local_38._M_p;
        }
        builder.wasm = (Module *)0x0;
        local_70._M_allocated_capacity = 0;
        local_60._M_p = (pointer)0x0;
        _Stack_58._M_p._0_4_ = 0x80000000;
        local_80.i64 = 0;
        local_130.i64 = 0;
        local_130._8_4_ = 3;
        local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                     *)&builder;
        local_118 = &local_80;
        bVar6 = Match::Internal::
                Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&>
                ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&>
                           *)&local_130.func,
                          (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>
                           )curr);
        if (bVar6) {
          curr->op = EqInt32;
          return (Expression *)curr;
        }
        if (*(int *)((left->type).id + 0x38) == 0) {
          builder.wasm = (Module *)0x0;
          local_70._M_allocated_capacity = 0;
          local_60._M_p = (pointer)0x0;
          _Stack_58._M_p = (pointer)0x8000000000000000;
          local_80.i64 = 0;
          local_130.i64 = 0;
          local_130._8_4_ = 0x1c;
          local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                       *)&builder;
          local_118 = &local_80;
          bVar6 = Match::Internal::
                  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                  ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                             *)&local_130.func,
                            (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>
                             )curr);
          if (bVar6) {
            curr->op = EqInt64;
            (curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 2;
            local_90._M_head_impl = (DylinkSection *)curr;
            goto LAB_00ae1b6c;
          }
        }
        local_70._M_allocated_capacity = 0;
        local_80.i64 = 0;
        local_130.i64 = 0;
        local_60._M_p = (pointer)0x0;
        _Stack_58._M_p = (pointer)0x0;
        local_130._8_4_ = 0x17;
        local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                     *)&builder;
        local_118 = &local_80;
        builder.wasm = (Module *)&local_90;
        bVar6 = Match::Internal::
                Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                           *)&local_130.func,
                          (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                           )curr);
        if (bVar6) {
          Literal::makeZero((Literal *)&local_80.func,(Type)0x2);
          Literal::operator=((Literal *)(local_38._M_p + 0x10),(Literal *)&local_80.func);
          goto LAB_00ae1e4e;
        }
        local_70._M_allocated_capacity = 0;
        local_60._M_p = (pointer)0x0;
        _Stack_58._M_p = (pointer)0xffffffffffffffff;
        local_80.i64 = 0;
        local_130.i64 = 0;
        local_130._8_4_ = 0x19;
        local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                     *)&builder;
        local_118 = &local_80;
        builder.wasm = (Module *)&local_90;
        bVar6 = Match::Internal::
                Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                           *)&local_130.func,
                          (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                           )curr);
        if (bVar6) {
          Literal::makeOne((Literal *)&local_80.func,(Type)0x2);
          Literal::operator=((Literal *)(local_38._M_p + 0x10),(Literal *)&local_80.func);
        }
        else {
          local_70._M_allocated_capacity = 0;
          local_60._M_p = (pointer)0x0;
          _Stack_58._M_p = (pointer)0xffffffffffffffff;
          local_80.i64 = 0;
          local_130.i64 = 0;
          local_130._8_4_ = 0x1b;
          local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                       *)&builder;
          local_118 = &local_80;
          builder.wasm = (Module *)&local_90;
          bVar6 = Match::Internal::
                  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                  ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                             *)&local_130.func,
                            (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                             )curr);
          if (!bVar6) {
            local_70._M_allocated_capacity = 0;
            local_80.i64 = 0;
            local_130.i64 = 0;
            local_60._M_p = (pointer)0x0;
            _Stack_58._M_p = (pointer)0x0;
            local_130._8_4_ = 0x1d;
            local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                         *)&builder;
            local_118 = &local_80;
            builder.wasm = (Module *)&local_90;
            bVar6 = Match::Internal::
                    Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                    ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                               *)&local_130.func,
                              (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                               )curr);
            if (bVar6) {
              Literal::makeOne((Literal *)&local_80.func,(Type)0x2);
              Literal::operator=((Literal *)(local_38._M_p + 0x10),(Literal *)&local_80.func);
              goto LAB_00ae1e4e;
            }
            builder.wasm = (Module *)0x0;
            local_70._M_allocated_capacity = 0;
            local_60._M_p = (pointer)0x0;
            _Stack_58._M_p = (pointer)0xffffffffffffffff;
            local_80.i64 = 0;
            local_130.i64 = 0;
            local_130._8_4_ = 0x17;
            local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                         *)&builder;
            local_118 = &local_80;
            bVar6 = Match::Internal::
                    Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                    ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                               *)&local_130.func,
                              (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                               )curr);
            if (bVar6) {
LAB_00ae2018:
              OVar4 = Ne;
LAB_00ae2066:
              BVar8 = Abstract::getBinary(type,OVar4);
              curr->op = BVar8;
              return (Expression *)curr;
            }
            builder.wasm = (Module *)0x0;
            local_70._M_allocated_capacity = 0;
            local_80.i64 = 0;
            local_130.i64 = 0;
            local_60._M_p = (pointer)0x0;
            _Stack_58._M_p = (pointer)0x0;
            local_130._8_4_ = 0x19;
            local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                         *)&builder;
            local_118 = &local_80;
            bVar6 = Match::Internal::
                    Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                    ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                               *)&local_130.func,
                              (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                               )curr);
            if (bVar6) {
LAB_00ae2064:
              OVar4 = Eq;
              goto LAB_00ae2066;
            }
            builder.wasm = (Module *)0x0;
            local_70._M_allocated_capacity = 0;
            local_80.i64 = 0;
            local_130.i64 = 0;
            local_60._M_p = (pointer)0x0;
            _Stack_58._M_p = (pointer)0x0;
            local_130._8_4_ = 0x1b;
            local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                         *)&builder;
            local_118 = &local_80;
            bVar6 = Match::Internal::
                    Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                    ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                               *)&local_130.func,
                              (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                               )curr);
            if (bVar6) goto LAB_00ae2018;
            builder.wasm = (Module *)0x0;
            local_70._M_allocated_capacity = 0;
            local_60._M_p = (pointer)0x0;
            _Stack_58._M_p = (pointer)0xffffffffffffffff;
            local_80.i64 = 0;
            local_130.i64 = 0;
            local_130._8_4_ = 0x1d;
            local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                         *)&builder;
            local_118 = &local_80;
            bVar6 = Match::Internal::
                    Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                    ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                               *)&local_130.func,
                              (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                               )curr);
            if (bVar6) goto LAB_00ae2064;
            local_70._M_allocated_capacity = 0;
            local_60._M_p = (pointer)0x0;
            local_130.i64 = 0;
            local_80.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_178;
            local_130._8_4_ = 0x16;
            local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                         *)&builder;
            local_118 = &local_80;
            builder.wasm = (Module *)&local_90;
            bVar6 = Match::Internal::
                    Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                    ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                               *)&local_130.func,
                              (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                               )curr);
            if ((bVar6) &&
               (bVar6 = Literal::isSignedMin
                                  ((((Literals *)((long)local_178 + 8))->
                                   super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems), bVar6)) {
              Literal::makeZero((Literal *)&local_80.func,(Type)0x2);
              Literal::operator=((Literal *)(local_38._M_p + 0x10),(Literal *)&local_80.func);
LAB_00ae1e4e:
              Literal::~Literal((Literal *)&local_80.func);
              ((Type *)(local_38._M_p + 8))->id = 2;
              return (Expression *)(Const *)local_38._M_p;
            }
            local_70._M_allocated_capacity = 0;
            local_60._M_p = (pointer)0x0;
            local_130.i64 = 0;
            local_80.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_178;
            local_130._8_4_ = 0x18;
            local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                         *)&builder;
            local_118 = &local_80;
            builder.wasm = (Module *)&local_90;
            bVar6 = Match::Internal::
                    Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                    ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                               *)&local_130.func,
                              (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                               )curr);
            if ((bVar6) &&
               (bVar6 = Literal::isSignedMax
                                  ((((Literals *)((long)local_178 + 8))->
                                   super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems), bVar6)) {
              Literal::makeOne((Literal *)&local_80.func,(Type)0x2);
              Literal::operator=((Literal *)(local_38._M_p + 0x10),(Literal *)&local_80.func);
              goto LAB_00ae1e4e;
            }
            local_70._M_allocated_capacity = 0;
            local_60._M_p = (pointer)0x0;
            local_130.i64 = 0;
            local_80.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_178;
            local_130._8_4_ = 0x1a;
            local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                         *)&builder;
            local_118 = &local_80;
            builder.wasm = (Module *)&local_90;
            bVar6 = Match::Internal::
                    Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                    ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                               *)&local_130.func,
                              (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                               )curr);
            if ((bVar6) &&
               (bVar6 = Literal::isSignedMax
                                  ((((Literals *)((long)local_178 + 8))->
                                   super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems), bVar6)) {
              Literal::makeZero((Literal *)&local_80.func,(Type)0x2);
              Literal::operator=((Literal *)(local_38._M_p + 0x10),(Literal *)&local_80.func);
              goto LAB_00ae1e4e;
            }
            local_70._M_allocated_capacity = 0;
            local_60._M_p = (pointer)0x0;
            local_130.i64 = 0;
            local_80.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_178;
            local_130._8_4_ = 0x1c;
            local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                         *)&builder;
            local_118 = &local_80;
            builder.wasm = (Module *)&local_90;
            bVar6 = Match::Internal::
                    Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                    ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                               *)&local_130.func,
                              (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                               )curr);
            if ((bVar6) &&
               (bVar6 = Literal::isSignedMin
                                  ((((Literals *)((long)local_178 + 8))->
                                   super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems), bVar6)) {
              Literal::makeOne((Literal *)&local_80.func,(Type)0x2);
              Literal::operator=((Literal *)(local_38._M_p + 0x10),(Literal *)&local_80.func);
              goto LAB_00ae1e4e;
            }
            builder.wasm = (Module *)0x0;
            local_70._M_allocated_capacity = 0;
            local_60._M_p = (pointer)0x0;
            local_130.i64 = 0;
            local_80.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_178;
            local_130._8_4_ = 0x16;
            local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                         *)&builder;
            local_118 = &local_80;
            bVar6 = Match::Internal::
                    Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                    ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                               *)&local_130.func,
                              (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                               )curr);
            if ((bVar6) &&
               (bVar6 = Literal::isSignedMax
                                  ((((Literals *)((long)local_178 + 8))->
                                   super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems), bVar6))
            goto LAB_00ae2018;
            builder.wasm = (Module *)0x0;
            local_70._M_allocated_capacity = 0;
            local_60._M_p = (pointer)0x0;
            local_130.i64 = 0;
            local_80.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_178;
            local_130._8_4_ = 0x18;
            local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                         *)&builder;
            local_118 = &local_80;
            bVar6 = Match::Internal::
                    Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                    ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                               *)&local_130.func,
                              (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                               )curr);
            if ((bVar6) &&
               (bVar6 = Literal::isSignedMin
                                  ((((Literals *)((long)local_178 + 8))->
                                   super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems), bVar6))
            goto LAB_00ae2064;
            builder.wasm = (Module *)0x0;
            local_70._M_allocated_capacity = 0;
            local_60._M_p = (pointer)0x0;
            local_130.i64 = 0;
            local_80.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_178;
            local_130._8_4_ = 0x1a;
            local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                         *)&builder;
            local_118 = &local_80;
            bVar6 = Match::Internal::
                    Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                    ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                               *)&local_130.func,
                              (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                               )curr);
            if ((bVar6) &&
               (bVar6 = Literal::isSignedMin
                                  ((((Literals *)((long)local_178 + 8))->
                                   super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems), bVar6))
            goto LAB_00ae2018;
            builder.wasm = (Module *)0x0;
            local_70._M_allocated_capacity = 0;
            local_60._M_p = (pointer)0x0;
            local_130.i64 = 0;
            local_80.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_178;
            local_130._8_4_ = 0x1c;
            local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                         *)&builder;
            local_118 = &local_80;
            bVar6 = Match::Internal::
                    Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                    ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                               *)&local_130.func,
                              (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                               )curr);
            if ((bVar6) &&
               (bVar6 = Literal::isSignedMax
                                  ((((Literals *)((long)local_178 + 8))->
                                   super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems), bVar6))
            goto LAB_00ae2064;
            local_70._M_allocated_capacity = 0;
            local_60._M_p = (pointer)0x0;
            _Stack_58._M_p = (pointer)0xffffffffffffffff;
            local_80.i64 = 0;
            local_130.i64 = 0;
            local_130._8_4_ = 5;
            local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                         *)&builder;
            local_118 = &local_80;
            builder.wasm = (Module *)&local_90;
            bVar6 = Match::Internal::
                    Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                    ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                               *)&local_130.func,
                              (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                               )curr);
            if (bVar6) {
              Literal::makeZero((Literal *)&local_80.func,type);
              Literal::operator=((Literal *)(local_38._M_p + 0x10),(Literal *)&local_80.func);
              Literal::~Literal((Literal *)&local_80.func);
              BVar8 = Abstract::getBinary(type,Sub);
              curr->op = BVar8;
              curr->left = (Expression *)local_38._M_p;
LAB_00ae285f:
              curr->right = (Expression *)local_90._M_head_impl;
              return (Expression *)curr;
            }
            local_70._M_allocated_capacity = 0;
            local_60._M_p = (pointer)0x0;
            _Stack_58._M_p = (pointer)0x1;
            local_80.i64 = 0;
            local_178 = (undefined1  [8])0x0;
            local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                         *)0x0;
            local_1f8 = (undefined1  [8])local_1a0;
            local_110 = (pointer)0x0;
            c_1 = (Const *)CONCAT44(c_1._4_4_,10);
            paStack_108 = (anon_union_16_6_1532cd5a_for_Literal_0 *)0xffffffffffffffff;
            local_130.i64 = 0;
            builder.wasm = (Module *)0x0;
            local_168.func.super_IString.str._M_str = local_1f8;
            local_168.i64 = (int64_t)&local_80;
            bVar6 = Match::Internal::
                    Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                    ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                               *)&builder,
                              (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                               )curr);
            if ((bVar6) && (*(char *)((left->type).id + 0x70) == '\0')) {
              BVar8 = Abstract::getBinary(type,RotL);
              curr->op = BVar8;
              Literal::makeFromInt32((Literal *)&local_80.func,-2,type);
              Literal::operator=((Literal *)(local_38._M_p + 0x10),(Literal *)&local_80.func);
              Literal::~Literal((Literal *)&local_80.func);
              curr->left = (Expression *)local_38._M_p;
              local_90._M_head_impl = (DylinkSection *)local_1a0;
              goto LAB_00ae285f;
            }
            local_70._M_allocated_capacity = 0;
            local_60._M_p = (pointer)0x0;
            _Stack_58._M_p = (pointer)0x4000000000000000;
            local_80.i64 = 0;
            local_130.i64 = 0;
            builder.wasm = (Module *)local_178;
            local_130._8_4_ = 5;
            local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                         *)&builder;
            local_118 = &local_80;
            bVar6 = Match::Internal::
                    Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<double>_>_>_>_&>
                    ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<double>_>_>_>_&>
                               *)&local_130.func,
                              (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                               )curr);
            if ((bVar6) &&
               ((((anon_union_16_6_1532cd5a_for_Literal_0 *)local_178)->v128[0] == '\b' ||
                (((anon_union_16_6_1532cd5a_for_Literal_0 *)local_178)->v128[0] == '\n')))) {
              BVar8 = Abstract::getBinary(type,Add);
              curr->op = BVar8;
              local_90._M_head_impl._0_4_ =
                   ExpressionManipulator::copy
                             ((EVP_PKEY_CTX *)local_178,(EVP_PKEY_CTX *)left[0x12].type.id);
              local_90._M_head_impl._4_4_ = extraout_var;
              goto LAB_00ae285f;
            }
            if (left[0x13]._id == BlockId) {
              builder.wasm = (Module *)0x0;
              local_70._M_allocated_capacity = 0;
              local_60._M_p = local_178;
              local_80.i64 = 0;
              local_130.i64 = 0;
              local_130._8_4_ = 3;
              local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                           *)&builder;
              local_118 = &local_80;
              bVar6 = Match::Internal::
                      Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&>
                      ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&>
                                 *)&local_130.func,
                                (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                                 )curr);
              if ((((bVar6) && ((double)local_178 == 0.0)) && (!NAN((double)local_178))) &&
                 ((long)local_178 < 0)) {
                return curr->left;
              }
            }
            local_178 = (undefined1  [8])0x0;
            local_70._M_allocated_capacity = 0;
            local_60._M_p = (pointer)0x0;
            c_1 = (Const *)CONCAT44(c_1._4_4_,1);
            local_80.i64 = 0;
            local_130.i64 = 0;
            local_168.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_1a0;
            local_130._8_4_ = 5;
            local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                         *)local_178;
            local_1a0 = (undefined1  [8])&local_90;
            local_118 = &local_80;
            bVar6 = Match::Internal::
                    Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&>
                    ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&>
                               *)&local_130.func,
                              (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                               )curr);
            if (!bVar6) {
              local_1f8 = (undefined1  [8])0x0;
              local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                           *)0x0;
              local_110 = (pointer)0x0;
              bin = (Binary *)CONCAT44(bin._4_4_,1);
              local_130.i64 = 0;
              builder.wasm = (Module *)0x0;
              local_1e8.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_1b0;
              local_1b0 = (undefined1  [8])&local_90;
              bVar6 = Match::Internal::
                      Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&>
                      ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&>
                                 *)&builder,
                                (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                                 )curr);
              if (!bVar6) {
                builder.wasm = (Module *)0x0;
                local_70._M_allocated_capacity = 0;
                local_60._M_p = (pointer)0x0;
                _Stack_58._M_p = (pointer)0xbff0000000000000;
                local_80.i64 = 0;
                local_130.i64 = 0;
                local_130._8_4_ = 5;
                local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                             *)&builder;
                local_118 = &local_80;
                bVar6 = Match::Internal::
                        Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<double>_>_>_>_&>
                        ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<double>_>_>_>_&>
                                   *)&local_130.func,
                                  (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                                   )curr);
                if (!bVar6) {
                  local_130.i64 = 0;
                  local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                               *)0x0;
                  local_80.i64 = 0;
                  local_118 = (anon_union_16_6_1532cd5a_for_Literal_0 *)CONCAT44(local_118._4_4_,1);
                  local_80._8_4_ = 5;
                  local_70._M_allocated_capacity = (size_type)local_1f8;
                  local_1f8 = (undefined1  [8])&local_90;
                  local_70._8_8_ = &local_130;
                  bVar6 = Match::Internal::
                          Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>_>_&>
                          ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>_>_&>
                                     *)&local_80.func,
                                    (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                                     )curr);
                  if (!bVar6) {
                    builder.wasm = (Module *)0x0;
                    local_80.i64 = 0;
                    local_80._8_4_ = 7;
                    local_70._M_allocated_capacity = (size_type)local_1a0;
                    local_70._8_8_ = &builder;
                    local_1a0 = (undefined1  [8])&local_90;
                    bVar6 = Match::Internal::
                            Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>_>_&>
                            ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>_>_&>
                                       *)&local_80.func,
                                      (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                                       )curr);
                    if (!bVar6) {
                      local_178 = (undefined1  [8])0x0;
                      local_168.i64 = 0;
                      local_80.i64 = 0;
                      local_168._8_4_ = 1;
                      local_80._8_4_ = 6;
                      local_70._M_allocated_capacity = (size_type)local_1b0;
                      local_70._8_8_ = local_178;
                      local_1b0 = (undefined1  [8])&local_90;
                      bVar6 = Match::Internal::
                              Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>_>_&>
                              ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>_>_&>
                                         *)&local_80.func,
                                        (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                                         )curr);
                      if (!bVar6) goto LAB_00ae29ea;
                    }
                  }
                  if (((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.
                       type.id & 0xfffffffffffffffe) == 2) {
                    return (Expression *)(Module *)local_90._M_head_impl;
                  }
                  if (left[0x13]._id == BlockId) {
                    return (Expression *)
                           (_Head_base<0UL,_wasm::DylinkSection_*,_false>)local_90._M_head_impl;
                  }
LAB_00ae29ea:
                  builder.wasm = (Module *)local_1a0;
                  local_70._M_allocated_capacity = 0;
                  local_60._M_p = (pointer)0x0;
                  local_130.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)local_1f8;
                  local_120 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                               *)0x0;
                  local_80.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)local_178;
                  local_110 = (pointer)&builder;
                  paStack_108 = &local_80;
                  bVar6 = Match::Internal::
                          Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&>
                          ::matches((Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&>
                                     *)&local_130.func,(candidate_t<wasm::Binary_*>)curr);
                  if (((bVar6) &&
                      (dVar15 = Literal::getFloat((((Literals *)((long)local_178 + 8))->
                                                  super_SmallVector<wasm::Literal,_1UL>).fixed.
                                                  _M_elems), NAN(dVar15))) &&
                     (BVar8 = (((Literals *)((long)local_1f8 + 8))->
                              super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].field_0.i32,
                     BVar10 = Abstract::getBinary((Type)((Type *)((long)local_1a0 + 8))->id,CopySign
                                                 ), BVar8 != BVar10)) {
                    bVar6 = Binary::isRelational((Binary *)local_1f8);
                    if (bVar6) {
                      (((Literals *)((long)local_178 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                      usedFixed = 2;
                      BVar8 = (((Literals *)((long)local_1f8 + 8))->
                              super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].field_0.i32;
                      BVar10 = Abstract::getBinary((Type)((Type *)((long)local_1a0 + 8))->id,Ne);
                      if (BVar8 == BVar10) {
                        Literal::makeOne((Literal *)&local_80.func,(Type)0x2);
                        Literal::operator=((((Literals *)((long)local_178 + 8))->
                                           super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems,
                                           (Literal *)&local_80.func);
                      }
                      else {
                        Literal::makeZero((Literal *)&local_80.func,(Type)0x2);
                        Literal::operator=((((Literals *)((long)local_178 + 8))->
                                           super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems,
                                           (Literal *)&local_80.func);
                      }
                    }
                    else {
                      Literal::standardizeNaN
                                ((Literal *)&local_80.func,
                                 (((Literals *)((long)local_178 + 8))->
                                 super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems);
                      Literal::operator=((((Literals *)((long)local_178 + 8))->
                                         super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems,
                                         (Literal *)&local_80.func);
                    }
                    Literal::~Literal((Literal *)&local_80.func);
                    return (Expression *)
                           (__uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>)
                           local_178;
                  }
                  return (Expression *)0x0;
                }
                if (left[0x13]._id != BlockId) {
                  BVar8 = Abstract::getBinary(type,Sub);
                  curr->op = BVar8;
                  Literal::makeZero((Literal *)&local_130.func,type);
                  Literal::neg((Literal *)&local_80.func,(Literal *)&local_130.func);
                  Literal::operator=((Literal *)(local_38._M_p + 0x10),(Literal *)&local_80.func);
                  Literal::~Literal((Literal *)&local_80.func);
                  Literal::~Literal((Literal *)&local_130.func);
                  uVar2 = curr->left;
                  uVar3 = curr->right;
                  auVar16._8_4_ = (int)uVar2;
                  auVar16._0_8_ = uVar3;
                  auVar16._12_4_ = (int)((ulong)uVar2 >> 0x20);
                  curr->left = (Expression *)uVar3;
                  curr->right = (Expression *)auVar16._8_8_;
                  return (Expression *)curr;
                }
                OVar4 = Neg;
                goto LAB_00ae159c;
              }
            }
            this_01 = (Literal *)(local_38._M_p + 0x10);
            Literal::neg((Literal *)&local_80.func,this_01);
            Literal::operator=(this_01,(Literal *)&local_80.func);
            goto LAB_00ae15e4;
          }
          Literal::makeZero((Literal *)&local_80.func,(Type)0x2);
          Literal::operator=((Literal *)(local_38._M_p + 0x10),(Literal *)&local_80.func);
        }
        Literal::~Literal((Literal *)&local_80.func);
        ((Type *)(local_38._M_p + 8))->id = 2;
        localInfoProvider = (OptimizeInstructions *)left;
LAB_00ae1c80:
        pEVar14 = getDroppedChildrenAndAppend
                            (localInfoProvider,(Expression *)curr,(Expression *)local_38._M_p);
        return pEVar14;
      }
LAB_00ae1a44:
      IVar9 = Bits::getMaxBits<wasm::OptimizeInstructions>
                        ((Expression *)local_90._M_head_impl,localInfoProvider);
      if (IVar9 != 1) goto LAB_00ae1a6e;
      UVar7 = WrapInt64;
    }
LAB_00ae15b9:
    curr = (Binary *)
           Builder::makeUnary((Builder *)&local_e8,UVar7,(Expression *)local_90._M_head_impl);
  }
  return (Expression *)curr;
}

Assistant:

Expression* optimizeWithConstantOnRight(Binary* curr) {
    using namespace Match;
    using namespace Abstract;
    Builder builder(*getModule());
    Expression* left;
    auto* right = curr->right->cast<Const>();
    auto type = curr->right->type;

    // Operations on zero
    if (matches(curr, binary(Shl, any(&left), ival(0))) ||
        matches(curr, binary(ShrU, any(&left), ival(0))) ||
        matches(curr, binary(ShrS, any(&left), ival(0))) ||
        matches(curr, binary(Or, any(&left), ival(0))) ||
        matches(curr, binary(Xor, any(&left), ival(0)))) {
      return left;
    }
    if (matches(curr, binary(Mul, pure(&left), ival(0))) ||
        matches(curr, binary(And, pure(&left), ival(0)))) {
      return right;
    }
    // -x * C   ==>    x * -C,   if  shrinkLevel != 0  or  C != C_pot
    // -x * C   ==>   -(x * C),  otherwise
    //    where  x, C  are integers
    Binary* inner;
    if (matches(
          curr,
          binary(Mul, binary(&inner, Sub, ival(0), any(&left)), ival()))) {
      if (getPassOptions().shrinkLevel != 0 ||
          !Bits::isPowerOf2(right->value.getInteger())) {
        right->value = right->value.neg();
        curr->left = left;
        return curr;
      } else {
        curr->left = left;
        Const* zero = inner->left->cast<Const>();
        return builder.makeBinary(inner->op, zero, curr);
      }
    }
    // x == 0   ==>   eqz x
    if (matches(curr, binary(Eq, any(&left), ival(0)))) {
      return builder.makeUnary(Abstract::getUnary(type, EqZ), left);
    }
    // Operations on one
    // (signed)x % 1   ==>   0
    if (matches(curr, binary(RemS, pure(&left), ival(1)))) {
      right->value = Literal::makeZero(type);
      return right;
    }
    // (signed)x % C_pot != 0   ==>  (x & (abs(C_pot) - 1)) != 0
    {
      Const* c;
      Binary* inner;
      if (matches(curr,
                  binary(Ne, binary(&inner, RemS, any(), ival(&c)), ival(0))) &&
          (c->value.isSignedMin() ||
           Bits::isPowerOf2(c->value.abs().getInteger()))) {
        inner->op = Abstract::getBinary(c->type, And);
        if (c->value.isSignedMin()) {
          c->value = Literal::makeSignedMax(c->type);
        } else {
          c->value = c->value.abs().sub(Literal::makeOne(c->type));
        }
        return curr;
      }
    }
    // i32(bool(x)) == 1  ==>  i32(bool(x))
    // i32(bool(x)) != 0  ==>  i32(bool(x))
    // i32(bool(x)) & 1   ==>  i32(bool(x))
    // i64(bool(x)) & 1   ==>  i64(bool(x))
    if ((matches(curr, binary(EqInt32, any(&left), i32(1))) ||
         matches(curr, binary(NeInt32, any(&left), i32(0))) ||
         matches(curr, binary(And, any(&left), ival(1)))) &&
        Bits::getMaxBits(left, this) == 1) {
      return left;
    }
    // i64(bool(x)) == 1  ==>  i32(bool(x))
    // i64(bool(x)) != 0  ==>  i32(bool(x))
    if ((matches(curr, binary(EqInt64, any(&left), i64(1))) ||
         matches(curr, binary(NeInt64, any(&left), i64(0)))) &&
        Bits::getMaxBits(left, this) == 1) {
      return builder.makeUnary(WrapInt64, left);
    }
    // bool(x) != 1  ==>  !bool(x)
    if (matches(curr, binary(Ne, any(&left), ival(1))) &&
        Bits::getMaxBits(left, this) == 1) {
      return builder.makeUnary(Abstract::getUnary(type, EqZ), left);
    }
    // bool(x)  ^ 1  ==>  !bool(x)
    if (matches(curr, binary(Xor, any(&left), ival(1))) &&
        Bits::getMaxBits(left, this) == 1) {
      auto* result = builder.makeUnary(Abstract::getUnary(type, EqZ), left);
      if (left->type == Type::i64) {
        // Xor's result is also an i64 in this case, but EqZ returns i32, so we
        // must expand it so that we keep returning the same value as before.
        // This means we replace a xor and a const with a xor and an extend,
        // which is still smaller (the const is 2 bytes, the extend just 1), and
        // also the extend may be removed by further work.
        result = builder.makeUnary(ExtendUInt32, result);
      }
      return result;
    }
    // bool(x) | 1  ==>  1
    if (matches(curr, binary(Or, any(&left), ival(1))) &&
        Bits::getMaxBits(left, this) == 1) {
      return getDroppedChildrenAndAppend(curr, right);
    }

    // Operations on all 1s
    // x & -1   ==>   x
    if (matches(curr, binary(And, any(&left), ival(-1)))) {
      return left;
    }
    // x | -1   ==>   -1
    if (matches(curr, binary(Or, any(&left), ival(-1)))) {
      return getDroppedChildrenAndAppend(curr, right);
    }
    // (signed)x % -1   ==>   0
    if (matches(curr, binary(RemS, pure(&left), ival(-1)))) {
      right->value = Literal::makeZero(type);
      return right;
    }
    // i32(x) / i32.min_s   ==>   x == i32.min_s
    if (matches(
          curr,
          binary(DivSInt32, any(), i32(std::numeric_limits<int32_t>::min())))) {
      curr->op = EqInt32;
      return curr;
    }
    // i64(x) / i64.min_s   ==>   i64(x == i64.min_s)
    // only for zero shrink level
    if (getPassOptions().shrinkLevel == 0 &&
        matches(
          curr,
          binary(DivSInt64, any(), i64(std::numeric_limits<int64_t>::min())))) {
      curr->op = EqInt64;
      curr->type = Type::i32;
      return builder.makeUnary(ExtendUInt32, curr);
    }
    // (unsigned)x < 0   ==>   i32(0)
    if (matches(curr, binary(LtU, pure(&left), ival(0)))) {
      right->value = Literal::makeZero(Type::i32);
      right->type = Type::i32;
      return right;
    }
    // (unsigned)x <= -1  ==>   i32(1)
    if (matches(curr, binary(LeU, any(&left), ival(-1)))) {
      right->value = Literal::makeOne(Type::i32);
      right->type = Type::i32;
      return getDroppedChildrenAndAppend(curr, right);
    }
    // (unsigned)x > -1   ==>   i32(0)
    if (matches(curr, binary(GtU, any(&left), ival(-1)))) {
      right->value = Literal::makeZero(Type::i32);
      right->type = Type::i32;
      return getDroppedChildrenAndAppend(curr, right);
    }
    // (unsigned)x >= 0   ==>   i32(1)
    if (matches(curr, binary(GeU, pure(&left), ival(0)))) {
      right->value = Literal::makeOne(Type::i32);
      right->type = Type::i32;
      return right;
    }
    // (unsigned)x < -1   ==>   x != -1
    // Friendlier to JS emitting as we don't need to write an unsigned -1 value
    // which is large.
    if (matches(curr, binary(LtU, any(), ival(-1)))) {
      curr->op = Abstract::getBinary(type, Ne);
      return curr;
    }
    // (unsigned)x <= 0   ==>   x == 0
    if (matches(curr, binary(LeU, any(), ival(0)))) {
      curr->op = Abstract::getBinary(type, Eq);
      return curr;
    }
    // (unsigned)x > 0   ==>   x != 0
    if (matches(curr, binary(GtU, any(), ival(0)))) {
      curr->op = Abstract::getBinary(type, Ne);
      return curr;
    }
    // (unsigned)x >= -1  ==>   x == -1
    if (matches(curr, binary(GeU, any(), ival(-1)))) {
      curr->op = Abstract::getBinary(type, Eq);
      return curr;
    }
    {
      Const* c;
      // (signed)x < (i32|i64).min_s   ==>   i32(0)
      if (matches(curr, binary(LtS, pure(&left), ival(&c))) &&
          c->value.isSignedMin()) {
        right->value = Literal::makeZero(Type::i32);
        right->type = Type::i32;
        return right;
      }
      // (signed)x <= (i32|i64).max_s   ==>   i32(1)
      if (matches(curr, binary(LeS, pure(&left), ival(&c))) &&
          c->value.isSignedMax()) {
        right->value = Literal::makeOne(Type::i32);
        right->type = Type::i32;
        return right;
      }
      // (signed)x > (i32|i64).max_s   ==>   i32(0)
      if (matches(curr, binary(GtS, pure(&left), ival(&c))) &&
          c->value.isSignedMax()) {
        right->value = Literal::makeZero(Type::i32);
        right->type = Type::i32;
        return right;
      }
      // (signed)x >= (i32|i64).min_s   ==>   i32(1)
      if (matches(curr, binary(GeS, pure(&left), ival(&c))) &&
          c->value.isSignedMin()) {
        right->value = Literal::makeOne(Type::i32);
        right->type = Type::i32;
        return right;
      }
      // (signed)x < (i32|i64).max_s   ==>   x != (i32|i64).max_s
      if (matches(curr, binary(LtS, any(), ival(&c))) &&
          c->value.isSignedMax()) {
        curr->op = Abstract::getBinary(type, Ne);
        return curr;
      }
      // (signed)x <= (i32|i64).min_s   ==>   x == (i32|i64).min_s
      if (matches(curr, binary(LeS, any(), ival(&c))) &&
          c->value.isSignedMin()) {
        curr->op = Abstract::getBinary(type, Eq);
        return curr;
      }
      // (signed)x > (i32|i64).min_s   ==>   x != (i32|i64).min_s
      if (matches(curr, binary(GtS, any(), ival(&c))) &&
          c->value.isSignedMin()) {
        curr->op = Abstract::getBinary(type, Ne);
        return curr;
      }
      // (signed)x >= (i32|i64).max_s   ==>   x == (i32|i64).max_s
      if (matches(curr, binary(GeS, any(), ival(&c))) &&
          c->value.isSignedMax()) {
        curr->op = Abstract::getBinary(type, Eq);
        return curr;
      }
    }
    // x * -1   ==>   0 - x
    if (matches(curr, binary(Mul, any(&left), ival(-1)))) {
      right->value = Literal::makeZero(type);
      curr->op = Abstract::getBinary(type, Sub);
      curr->left = right;
      curr->right = left;
      return curr;
    }
    {
      // ~(1 << x) aka (1 << x) ^ -1  ==>  rotl(-2, x)
      Expression* x;
      // Note that we avoid this in JS mode, as emitting a rotation would
      // require lowering that rotation for JS in another cycle of work.
      if (matches(curr, binary(Xor, binary(Shl, ival(1), any(&x)), ival(-1))) &&
          !getPassOptions().targetJS) {
        curr->op = Abstract::getBinary(type, RotL);
        right->value = Literal::makeFromInt32(-2, type);
        curr->left = right;
        curr->right = x;
        return curr;
      }
    }
    {
      // x * 2.0  ==>  x + x
      // but we apply this only for simple expressions like
      // local.get and global.get for avoid using extra local
      // variable.
      Expression* x;
      if (matches(curr, binary(Mul, any(&x), fval(2.0))) &&
          (x->is<LocalGet>() || x->is<GlobalGet>())) {
        curr->op = Abstract::getBinary(type, Abstract::Add);
        curr->right = ExpressionManipulator::copy(x, *getModule());
        return curr;
      }
    }
    {
      // x + (-0.0)   ==>   x
      double value;
      if (fastMath && matches(curr, binary(Add, any(), fval(&value))) &&
          value == 0.0 && std::signbit(value)) {
        return curr->left;
      }
    }
    // -x * fval(C)   ==>   x * -C
    // -x / fval(C)   ==>   x / -C
    if (matches(curr, binary(Mul, unary(Neg, any(&left)), fval())) ||
        matches(curr, binary(DivS, unary(Neg, any(&left)), fval()))) {
      right->value = right->value.neg();
      curr->left = left;
      return curr;
    }
    // x * -1.0   ==>
    //       -x,  if fastMath == true
    // -0.0 - x,  if fastMath == false
    if (matches(curr, binary(Mul, any(), fval(-1.0)))) {
      if (fastMath) {
        return builder.makeUnary(Abstract::getUnary(type, Neg), left);
      }
      // x * -1.0   ==>  -0.0 - x
      curr->op = Abstract::getBinary(type, Sub);
      right->value = Literal::makeZero(type).neg();
      std::swap(curr->left, curr->right);
      return curr;
    }
    if (matches(curr, binary(Mul, any(&left), constant(1))) ||
        matches(curr, binary(DivS, any(&left), constant(1))) ||
        matches(curr, binary(DivU, any(&left), constant(1)))) {
      if (curr->type.isInteger() || fastMath) {
        return left;
      }
    }
    {
      //   x !=  NaN   ==>   1
      //   x <=> NaN   ==>   0
      //   x op  NaN'  ==>   NaN',  iff `op` != `copysign` and `x` != C
      Const* c;
      Binary* bin;
      Expression* x;
      if (matches(curr, binary(&bin, pure(&x), fval(&c))) &&
          std::isnan(c->value.getFloat()) &&
          bin->op != getBinary(x->type, CopySign)) {
        if (bin->isRelational()) {
          // reuse "c" (nan) constant
          c->type = Type::i32;
          if (bin->op == getBinary(x->type, Ne)) {
            // x != NaN  ==>  1
            c->value = Literal::makeOne(Type::i32);
          } else {
            // x == NaN,
            // x >  NaN,
            // x <= NaN
            // x .. NaN  ==>  0
            c->value = Literal::makeZero(Type::i32);
          }
          return c;
        }
        // propagate NaN of RHS but canonicalize it
        c->value = Literal::standardizeNaN(c->value);
        return c;
      }
    }
    return nullptr;
  }